

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void non_modal_cb(Fl_Light_Button *i,void *v)

{
  char cVar1;
  int iVar2;
  void *v_local;
  Fl_Light_Button *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x21])();
    if (iVar2 == 0) {
      (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[6])();
    }
    else {
      (*(i->super_Fl_Button).super_Fl_Widget._vptr_Fl_Widget[5])();
      Fl_Button::value(&i->super_Fl_Button,(uint)(byte)current_widget[1].super_Fl_Type.field_0x45);
    }
  }
  else {
    cVar1 = Fl_Button::value(&i->super_Fl_Button);
    current_widget[1].super_Fl_Type.field_0x45 = cVar1;
    set_modflag(1);
  }
  return;
}

Assistant:

void non_modal_cb(Fl_Light_Button* i, void* v) {
  if (v == LOAD) {
    if (!current_widget->is_window()) {i->hide(); return;}
    i->show();
    i->value(((Fl_Window_Type *)current_widget)->non_modal);
  } else {
    ((Fl_Window_Type *)current_widget)->non_modal = i->value();
    set_modflag(1);
  }
}